

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_teebuf.hpp
# Opt level: O0

void __thiscall
OpenMD::basic_teebuf<char,_std::char_traits<char>_>::sync
          (basic_teebuf<char,_std::char_traits<char>_> *this)

{
  bool bVar1;
  int_type iVar2;
  int iVar3;
  iterator __lhs;
  iterator iter;
  __normal_iterator<std::basic_streambuf<char,_std::char_traits<char>_>_**,_std::vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>_>
  local_20;
  int_type local_18;
  int_type local_14;
  basic_teebuf<char,_std::char_traits<char>_> *local_10;
  
  local_10 = this;
  iVar2 = std::char_traits<char>::eof();
  local_14 = (**(code **)(*(long *)this + 0x68))(this,iVar2);
  local_18 = std::char_traits<char>::eof();
  bVar1 = std::char_traits<char>::eq_int_type(&local_14,&local_18);
  if (!bVar1) {
    __gnu_cxx::
    __normal_iterator<std::basic_streambuf<char,_std::char_traits<char>_>_**,_std::vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>_>
    ::__normal_iterator(&local_20);
    local_20._M_current =
         (basic_streambuf<char,_std::char_traits<char>_> **)
         std::
         vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>
         ::begin((vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>
                  *)this);
    while( true ) {
      __lhs = std::
              vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>
              ::end((vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>
                     *)this);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::basic_streambuf<char,_std::char_traits<char>_>_**,_std::vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>_>
                          *)__lhs._M_current,
                         (__normal_iterator<std::basic_streambuf<char,_std::char_traits<char>_>_**,_std::vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>_>
                          *)this);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<std::basic_streambuf<char,_std::char_traits<char>_>_**,_std::vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>_>
      ::operator*(&local_20);
      iVar3 = std::streambuf::pubsync();
      if (iVar3 == -1) {
        return;
      }
      __gnu_cxx::
      __normal_iterator<std::basic_streambuf<char,_std::char_traits<char>_>_**,_std::vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>_>
      ::operator++(&local_20);
    }
  }
  return;
}

Assistant:

int sync() {
      // flush buffer, checking return for eof.
      if (traits_type::eq_int_type(overflow(traits_type::eof()),
                                   traits_type::eof())) {
        return -1;
      }

      // flush streams
      typename std::vector<streambuf_type*>::iterator iter;
      for (iter = buffers_.begin(); iter != buffers_.end(); ++iter) {
        if ((*iter)->pubsync() == -1) { return -1; }
      }

      return 0;
    }